

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# APInt.cpp
# Opt level: O3

void __thiscall llvm::APInt::Profile(APInt *this,FoldingSetNodeID *ID)

{
  uint uVar1;
  uint i;
  ulong uVar2;
  
  FoldingSetNodeID::AddInteger(ID,this->BitWidth);
  uVar1 = this->BitWidth;
  if ((ulong)uVar1 < 0x41) {
    FoldingSetNodeID::AddInteger(ID,(this->U).VAL);
    return;
  }
  uVar2 = 0;
  do {
    FoldingSetNodeID::AddInteger(ID,(this->U).pVal[uVar2]);
    uVar2 = uVar2 + 1;
  } while ((ulong)uVar1 + 0x3f >> 6 != uVar2);
  return;
}

Assistant:

void APInt::Profile(FoldingSetNodeID& ID) const {
  ID.AddInteger(BitWidth);

  if (isSingleWord()) {
    ID.AddInteger(U.VAL);
    return;
  }

  unsigned NumWords = getNumWords();
  for (unsigned i = 0; i < NumWords; ++i)
    ID.AddInteger(U.pVal[i]);
}